

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::aux::split_string
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,aux *this,string_view last,char sep)

{
  aux *paVar1;
  void *pvVar2;
  aux *paVar3;
  long lVar4;
  aux *__s;
  aux *paVar5;
  size_type __n;
  
  __s = (aux *)last._M_len;
  if (this != (aux *)0x0) {
    pvVar2 = memchr(__s,(int)(char)last._M_str,(size_t)this);
    paVar3 = (aux *)((long)pvVar2 - (long)__s);
    if (paVar3 != (aux *)0xffffffffffffffff && pvVar2 != (void *)0x0) {
      paVar1 = paVar3 + 1;
      if (this <= paVar3) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   paVar1,this);
      }
      paVar5 = paVar1 + (long)__s;
      (__return_storage_ptr__->first)._M_len = (size_t)paVar3;
      (__return_storage_ptr__->first)._M_str = (char *)__s;
      (__return_storage_ptr__->second)._M_len = (long)this - (long)paVar1;
      lVar4 = 0x18;
      goto LAB_003082a2;
    }
  }
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  (__return_storage_ptr__->first)._M_len = (size_t)this;
  lVar4 = 8;
  paVar5 = __s;
LAB_003082a2:
  *(aux **)((long)&(__return_storage_ptr__->first)._M_len + lVar4) = paVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> split_string(string_view last, char const sep)
	{
		auto const pos = last.find(sep);
		if (pos == string_view::npos) return {last, {}};
		else return {last.substr(0, pos), last.substr(pos + 1)};
	}